

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinPKZB_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  long lVar1;
  double vl;
  double dStack_38;
  
  if (0 < N) {
    lVar1 = 0;
    do {
      mgga_screening_interface<ExchCXX::BuiltinPKZB_X>::eval_exc_vxc_unpolar
                (*(double *)((long)rho + lVar1),*(double *)((long)sigma + lVar1),0.0,
                 *(double *)((long)tau + lVar1),(double *)((long)eps + lVar1),
                 (double *)((long)vrho + lVar1),(double *)((long)vsigma + lVar1),&dStack_38,
                 (double *)((long)vtau + lVar1));
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double vl;
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i],
      eps[i], vrho[i], vsigma[i], vl, vtau[i] );
    if(traits::needs_laplacian) vlapl[i] = vl;

  }

}